

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent.cpp
# Opt level: O0

void __thiscall libtorrent::aux::torrent::finished(torrent *this)

{
  peer_connection *ppVar1;
  bool bVar2;
  int iVar3;
  time_t tVar4;
  session_settings *this_00;
  vector<peer_connection_*> *this_01;
  reference pppVar5;
  undefined4 extraout_var;
  bool local_122;
  bool local_111;
  enable_shared_from_this<libtorrent::aux::torrent> local_110;
  code *local_100;
  undefined8 local_f8;
  type local_f0;
  function<void_()> local_c8;
  uint local_a8;
  undefined1 local_a1;
  error_code local_a0;
  reference local_90;
  peer_connection **p_1;
  iterator __end3_1;
  iterator __begin3_1;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  *__range3_1;
  peer_connection *local_50;
  peer_connection *p;
  iterator __end3;
  iterator __begin3;
  vector<peer_connection_*> *__range3;
  vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  seeds;
  torrent *this_local;
  
  update_want_tick(this);
  update_state_list(this);
  set_state(this,finished);
  seeds.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0xffffffff;
  set_queue_position(this,(queue_position_t)0xffffffff);
  seeds.
  super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = time_now32();
  (this->m_became_finished).__d.__r =
       (rep_conflict)
       seeds.
       super__Vector_base<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_;
  bVar2 = is_seed(this);
  if (bVar2) {
    completed(this);
  }
  send_upload_only(this);
  state_updated(this);
  if (this->m_completed_time == 0) {
    tVar4 = time((time_t *)0x0);
    this->m_completed_time = tVar4;
  }
  this_00 = settings(this);
  bVar2 = session_settings::get_bool(this_00,0x800e);
  if (bVar2) {
    ::std::
    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ::vector((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
              *)&__range3);
    this_01 = &(this->super_torrent_hot_members).m_connections;
    __end3 = ::std::
             vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             ::begin(&this_01->
                      super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                    );
    p = (peer_connection *)
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::end(&this_01->
               super_vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
             );
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                                       *)&p), bVar2) {
      pppVar5 = __gnu_cxx::
                __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                ::operator*(&__end3);
      local_50 = *pppVar5;
      bVar2 = peer_connection::upload_only(local_50);
      ppVar1 = local_50;
      local_122 = false;
      if (bVar2) {
        boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                  ((error_code *)&__range3_1,torrent_finished,(type *)0x0);
        local_122 = peer_connection::can_disconnect(ppVar1,(error_code *)&__range3_1);
      }
      if (local_122 != false) {
        peer_connection::peer_log(local_50,info,"SEED","CLOSING CONNECTION");
        ::std::
        vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
        ::push_back((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                     *)&__range3,&local_50);
      }
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end3);
    }
    __end3_1 = ::std::
               vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               ::begin((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                        *)&__range3);
    p_1 = (peer_connection **)
          ::std::
          vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
          ::end((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
                 *)&__range3);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3_1,
                              (__normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                               *)&p_1), bVar2) {
      local_90 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
                 ::operator*(&__end3_1);
      ppVar1 = *local_90;
      boost::system::error_code::error_code<libtorrent::errors::error_code_enum>
                (&local_a0,torrent_finished,(type *)0x0);
      local_a1 = 0;
      (*(ppVar1->super_bandwidth_socket)._vptr_bandwidth_socket[0x14])(ppVar1,&local_a0,1,0);
      __gnu_cxx::
      __normal_iterator<libtorrent::aux::peer_connection_**,_std::vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>_>
      ::operator++(&__end3_1);
    }
    ::std::
    vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
    ::~vector((vector<libtorrent::aux::peer_connection_*,_std::allocator<libtorrent::aux::peer_connection_*>_>
               *)&__range3);
  }
  if ((*(ulong *)&(this->super_torrent_hot_members).field_0x48 >> 0x1a & 1) == 0) {
    update_want_peers(this);
    bVar2 = storage_holder::operator_cast_to_bool(&this->m_storage);
    if (bVar2) {
      iVar3 = (*(((this->super_torrent_hot_members).m_ses)->super_session_logger).
                _vptr_session_logger[4])();
      local_a8 = (uint)storage_holder::operator_cast_to_strong_typedef(&this->m_storage);
      local_100 = on_cache_flushed;
      local_f8 = 0;
      ::std::enable_shared_from_this<libtorrent::aux::torrent>::shared_from_this(&local_110);
      local_111 = false;
      ::std::
      bind<void(libtorrent::aux::torrent::*)(bool),std::shared_ptr<libtorrent::aux::torrent>,bool>
                (&local_f0,(offset_in_torrent_to_subr *)&local_100,
                 (shared_ptr<libtorrent::aux::torrent> *)&local_110,&local_111);
      ::std::function<void()>::
      function<std::_Bind<void(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,bool))(bool)>,void>
                ((function<void()> *)&local_c8,&local_f0);
      (**(code **)(*(long *)CONCAT44(extraout_var,iVar3) + 0x38))
                ((long *)CONCAT44(extraout_var,iVar3),local_a8,&local_c8);
      ::std::function<void_()>::~function(&local_c8);
      ::std::
      _Bind<void_(libtorrent::aux::torrent::*(std::shared_ptr<libtorrent::aux::torrent>,_bool))(bool)>
      ::~_Bind(&local_f0);
      ::std::shared_ptr<libtorrent::aux::torrent>::~shared_ptr
                ((shared_ptr<libtorrent::aux::torrent> *)&local_110);
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x1f]
      )();
    }
    if ((*(uint *)&this->field_0x600 & 1) != 0) {
      (*(((this->super_torrent_hot_members).m_ses)->super_session_logger)._vptr_session_logger[0x2c]
      )();
    }
  }
  return;
}

Assistant:

void torrent::finished()
	{
		update_want_tick();
		update_state_list();

		INVARIANT_CHECK;

		TORRENT_ASSERT(is_finished());

		set_state(torrent_status::finished);
		set_queue_position(no_pos);

		m_became_finished = aux::time_now32();

		// we have to call completed() before we start
		// disconnecting peers, since there's an assert
		// to make sure we're cleared the piece picker
		if (is_seed()) completed();

		send_upload_only();
		state_updated();

		if (m_completed_time == 0)
			m_completed_time = time(nullptr);

		// disconnect all seeds
		if (settings().get_bool(settings_pack::close_redundant_connections))
		{
			// TODO: 1 should disconnect all peers that have the pieces we have
			// not just seeds. It would be pretty expensive to check all pieces
			// for all peers though
			std::vector<peer_connection*> seeds;
			for (auto* p : m_connections)
			{
				TORRENT_INCREMENT(m_iterating_connections);
				TORRENT_ASSERT(p->associated_torrent().lock().get() == this);
				if (p->upload_only() && p->can_disconnect(errors::torrent_finished))
				{
#ifndef TORRENT_DISABLE_LOGGING
					p->peer_log(peer_log_alert::info, "SEED", "CLOSING CONNECTION");
#endif
					seeds.push_back(p);
				}
			}
			for (auto& p : seeds)
				p->disconnect(errors::torrent_finished, operation_t::bittorrent
					, peer_connection_interface::normal);
		}

		if (m_abort) return;

		update_want_peers();

		if (m_storage)
		{
			// we need to keep the object alive during this operation
			m_ses.disk_thread().async_release_files(m_storage
				, std::bind(&torrent::on_cache_flushed, shared_from_this(), false));
			m_ses.deferred_submit_jobs();
		}

		// this torrent just completed downloads, which means it will fall
		// under a different limit with the auto-manager. Make sure we
		// update auto-manage torrents in that case
		if (m_auto_managed)
			m_ses.trigger_auto_manage();
	}